

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O3

void __thiscall Rml::DecoratorTextInstancer::~DecoratorTextInstancer(DecoratorTextInstancer *this)

{
  ~DecoratorTextInstancer(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

SharedPtr<Decorator> DecoratorTextInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& /*instancer_interface*/)
{
	const Property* p_text = properties.GetProperty(ids.text);
	const Property* p_color = properties.GetProperty(ids.color);
	Array<const Property*, 2> p_align = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};
	if (!p_text || !p_color || !p_align[0] || !p_align[1])
		return nullptr;

	String text = StringUtilities::DecodeRml(p_text->Get<String>());
	if (text.empty())
		return nullptr;

	const bool inherit_color = (p_color->unit == Unit::KEYWORD);
	const Colourb color = (p_color->unit == Unit::COLOUR ? p_color->Get<Colourb>() : Colourb{});
	const Vector2Numeric align = ComputePosition(p_align);

	auto decorator = MakeShared<DecoratorText>();
	decorator->Initialise(std::move(text), inherit_color, color, align);
	return decorator;
}